

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O1

uint32_t helper_neon_cls_s16_aarch64(uint32_t arg)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  ushort uVar4;
  
  uVar4 = (ushort)((uint)(int)(short)(ushort)arg >> 0xf) ^ (ushort)arg;
  uVar2 = 0x10;
  uVar3 = 0x10;
  if (uVar4 != 0) {
    uVar1 = 0xf;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    uVar3 = uVar1 ^ 0xf;
  }
  uVar4 = (ushort)(arg >> 0x10);
  uVar4 = (short)uVar4 >> 0xf ^ uVar4;
  if (uVar4 != 0) {
    uVar1 = 0xf;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    uVar2 = uVar1 ^ 0xf;
  }
  return (uVar2 * 0x10000 + (uVar3 - 1 & 0xffff)) - 0x10000;
}

Assistant:

uint32_t HELPER(neon_cls_s32)(uint32_t x)
{
    int count;
    if ((int32_t)x < 0)
        x = ~x;
    for (count = 32; x; count--)
        x = x >> 1;
    return count - 1;
}